

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.c
# Opt level: O2

void reset_mem_pool(mem_pool **root,size_t target_used_mem)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  mem_pool *mem_pool;
  
  mem_pool = *root;
  uVar2 = get_used_mem(mem_pool);
  while( true ) {
    if ((mem_pool->prev == (mem_pool *)0x0) ||
       (uVar3 = uVar2 - target_used_mem, uVar2 < target_used_mem || uVar3 == 0)) goto LAB_00108ae5;
    uVar1 = mem_pool->size;
    if (uVar1 < uVar3) break;
    uVar2 = uVar2 - uVar1;
    mem_pool->size = 0;
    mem_pool = mem_pool->prev;
  }
  mem_pool->size = uVar1 - uVar3;
LAB_00108ae5:
  *root = mem_pool;
  return;
}

Assistant:

void reset_mem_pool(struct mem_pool** root, size_t target_used_mem) {
    struct mem_pool* cur = *root;
    size_t used_mem = get_used_mem(cur);
    while (cur->prev && used_mem > target_used_mem) {
        if (used_mem - target_used_mem > cur->size) {
            cur->size -= used_mem - target_used_mem;
            break;
        } else {
            used_mem -= cur->size;
            cur->size = 0;
            cur = cur->prev;
        }
    }
    *root = cur;
}